

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.h
# Opt level: O2

void __thiscall jaegertracing::thrift::Span::Span(Span *this)

{
  *(undefined ***)this = &PTR__Span_0029b238;
  this->traceIdLow = 0;
  this->traceIdHigh = 0;
  this->spanId = 0;
  this->parentSpanId = 0;
  (this->operationName)._M_dataplus._M_p = (pointer)&(this->operationName).field_2;
  (this->operationName)._M_string_length = 0;
  (this->operationName).field_2._M_local_buf[0] = '\0';
  (this->references).
  super__Vector_base<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->references).
  super__Vector_base<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->references).
           super__Vector_base<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->references).
           super__Vector_base<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->startTime = 0;
  this->duration = 0;
  (this->tags).
  super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->logs).
  super__Vector_base<jaegertracing::thrift::Log,_std::allocator<jaegertracing::thrift::Log>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->logs).
  super__Vector_base<jaegertracing::thrift::Log,_std::allocator<jaegertracing::thrift::Log>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->logs).
  super__Vector_base<jaegertracing::thrift::Log,_std::allocator<jaegertracing::thrift::Log>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->__isset = (_Span__isset)((byte)this->__isset & 0xf8);
  return;
}

Assistant:

Span() : traceIdLow(0), traceIdHigh(0), spanId(0), parentSpanId(0), operationName(), flags(0), startTime(0), duration(0) {
  }